

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPSender.hpp
# Opt level: O0

void __thiscall Statsd::UDPSender::queueMessage(UDPSender *this,string *message)

{
  bool bVar1;
  ulong uVar2;
  reference pvVar3;
  undefined1 local_28 [8];
  unique_lock<std::mutex> batchingLock;
  string *message_local;
  UDPSender *this_local;
  
  batchingLock._8_8_ = message;
  bVar1 = std::thread::joinable(&this->m_batchingThread);
  if (bVar1) {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_28,&this->m_batchingMutex);
  }
  else {
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28);
  }
  bVar1 = std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->m_batchingMessageQueue);
  if (!bVar1) {
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::back(&this->m_batchingMessageQueue);
    uVar2 = std::__cxx11::string::length();
    if (uVar2 <= this->m_batchsize) {
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back(&this->m_batchingMessageQueue);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        pvVar3 = std::
                 deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::back(&this->m_batchingMessageQueue);
        std::__cxx11::string::push_back((char)pvVar3);
      }
      goto LAB_0010bf5b;
    }
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::emplace_back<>(&this->m_batchingMessageQueue);
  pvVar3 = std::
           deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::back(&this->m_batchingMessageQueue);
  std::__cxx11::string::reserve((ulong)pvVar3);
LAB_0010bf5b:
  pvVar3 = std::
           deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::back(&this->m_batchingMessageQueue);
  std::__cxx11::string::append((string *)pvVar3);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return;
}

Assistant:

inline void UDPSender::queueMessage(const std::string& message) noexcept {
    // We aquire a lock but only if we actually need to (i.e. there is a thread also accessing the queue)
    auto batchingLock =
        m_batchingThread.joinable() ? std::unique_lock<std::mutex>(m_batchingMutex) : std::unique_lock<std::mutex>();
    // Either we don't have a place to batch our message or we exceeded the batch size, so make a new batch
    if (m_batchingMessageQueue.empty() || m_batchingMessageQueue.back().length() > m_batchsize) {
        m_batchingMessageQueue.emplace_back();
        m_batchingMessageQueue.back().reserve(m_batchsize + 256);
    }  // When there is already a batch open we need a separator when its not empty
    else if (!m_batchingMessageQueue.back().empty()) {
        m_batchingMessageQueue.back().push_back('\n');
    }
    // Add the new message to the batch
    m_batchingMessageQueue.back().append(message);
}